

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
cppqc::detail::ChooseStatelessGenerator<int>::shrink(ChooseStatelessGenerator<int> *this,int x)

{
  int iVar1;
  int iVar2;
  int in_EDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  int i_1;
  int i;
  vector<int,_std::allocator<int>_> *ret;
  vector<int,_std::allocator<int>_> *__x;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_28;
  uint3 in_stack_ffffffffffffffe8;
  uint uVar3;
  vector<int,_std::allocator<int>_> *this_00;
  
  uVar3 = (uint)in_stack_ffffffffffffffe8;
  __x = in_RDI;
  this_00 = in_RSI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1160b2);
  std::vector<int,_std::allocator<int>_>::reserve(this_00,CONCAT44(in_EDX,uVar3));
  iVar1 = *(int *)&(in_RSI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  iVar2 = *(int *)((long)&(in_RSI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start + 4);
  if (iVar2 < 1) {
    iVar2 = -iVar2;
  }
  if (iVar2 < iVar1) {
    for (iVar1 = *(int *)((long)&(in_RSI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start + 4); iVar1 != in_EDX;
        iVar1 = iVar1 + -1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                 (value_type *)__x);
    }
  }
  else {
    for (local_28 = *(int *)&(in_RSI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start; local_28 != in_EDX;
        local_28 = local_28 + 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(value_type *)__x);
    }
  }
  return in_RDI;
}

Assistant:

std::vector<Integer> shrink(Integer x) const {
    std::vector<Integer> ret;
    ret.reserve(x - m_min);
    if (abs(m_min) <= abs(m_max)) {
      for (Integer i = m_min; i != x; ++i)
        ret.push_back(i);
    } else {
      for (Integer i = m_max; i != x; --i)
        ret.push_back(i);
    }
    return ret;
  }